

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteDot.c
# Opt level: O1

void Io_WriteDotNtk(Abc_Ntk_t *pNtk,Vec_Ptr_t *vNodes,Vec_Ptr_t *vNodesShow,char *pFileName,
                   int fGateNames,int fUseReverse)

{
  uint *puVar1;
  char cVar2;
  Abc_Obj_t *pAVar3;
  void *pvVar4;
  long *plVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  FILE *__stream;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  Mio_Gate_t *pGate;
  Abc_Obj_t *pAVar17;
  ulong uVar18;
  bool bVar19;
  
  if ((pNtk->ntkType & ~ABC_NTK_NETLIST) != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteDot.c"
                  ,0x4f,
                  "void Io_WriteDotNtk(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, char *, int, int)");
  }
  if (vNodes->nSize < 1) {
    pcVar12 = "The set has no nodes. DOT file is not written.";
  }
  else {
    if (500 < vNodes->nSize) {
      printf("The set has more than %d nodes. DOT file is not written.\n",500);
      return;
    }
    __stream = fopen(pFileName,"w");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",pFileName);
      return;
    }
    bVar19 = true;
    if (pNtk->ntkFunc == ABC_FUNC_BDD) {
      bVar19 = pNtk->ntkType != ABC_NTK_LOGIC;
    }
    if ((bVar19) || (iVar8 = Abc_NtkBddToSop(pNtk,-1,1000000000), iVar8 != 0)) {
      if (0 < vNodes->nSize) {
        lVar11 = 0;
        do {
          puVar1 = (uint *)((long)vNodes->pArray[lVar11] + 0x14);
          *puVar1 = *puVar1 | 0x40;
          lVar11 = lVar11 + 1;
        } while (lVar11 < vNodes->nSize);
      }
      if ((vNodesShow != (Vec_Ptr_t *)0x0) && (0 < vNodesShow->nSize)) {
        lVar11 = 0;
        do {
          puVar1 = (uint *)((long)vNodesShow->pArray[lVar11] + 0x14);
          *puVar1 = *puVar1 | 0x20;
          lVar11 = lVar11 + 1;
        } while (lVar11 < vNodesShow->nSize);
      }
      iVar8 = Abc_NtkLevel(pNtk);
      if (fUseReverse != 0) {
        iVar9 = Abc_NtkLevelReverse(pNtk);
        if (iVar8 != iVar9) {
          __assert_fail("LevelMax == LevelMin",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteDot.c"
                        ,0x7a,
                        "void Io_WriteDotNtk(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, char *, int, int)"
                       );
        }
        if (0 < vNodes->nSize) {
          lVar11 = 0;
          do {
            uVar10 = *(uint *)((long)vNodes->pArray[lVar11] + 0x14);
            if ((uVar10 & 0xf) == 7) {
              *(uint *)((long)vNodes->pArray[lVar11] + 0x14) =
                   (uVar10 & 0xff7) + (iVar8 - (uVar10 >> 0xc)) * 0x1000 + 0x1000;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < vNodes->nSize);
        }
      }
      if ((long)vNodes->nSize < 1) {
        iVar8 = 0;
        uVar15 = 0xffffffff;
        uVar10 = 10000;
      }
      else {
        uVar10 = 10000;
        uVar15 = 0xffffffff;
        lVar11 = 0;
        iVar8 = 0;
        do {
          uVar16 = *(uint *)((long)vNodes->pArray[lVar11] + 0x14);
          if ((uVar16 & 0xf) - 5 < 0xfffffffe) {
            uVar16 = uVar16 >> 0xc;
            if (uVar16 <= uVar10) {
              uVar10 = uVar16;
            }
            if ((int)uVar15 <= (int)uVar16) {
              uVar15 = uVar16;
            }
          }
          else {
            iVar8 = 1;
          }
          lVar11 = lVar11 + 1;
        } while (vNodes->nSize != lVar11);
      }
      if ((iVar8 != 0) && (uVar15 = uVar15 + 1, 0 < vNodes->nSize)) {
        lVar11 = 0;
        do {
          uVar16 = *(uint *)((long)vNodes->pArray[lVar11] + 0x14);
          if (0xfffffffd < (uVar16 & 0xf) - 5) {
            *(uint *)((long)vNodes->pArray[lVar11] + 0x14) = uVar16 & 0xfff | uVar15 * 0x1000;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < vNodes->nSize);
      }
      fprintf(__stream,"# %s\n","Network structure generated by ABC");
      fputc(10,__stream);
      fwrite("digraph network {\n",0x12,1,__stream);
      fwrite("size = \"7.5,10\";\n",0x11,1,__stream);
      fwrite("center = true;\n",0xf,1,__stream);
      fwrite("edge [dir = back];\n",0x13,1,__stream);
      fputc(10,__stream);
      fwrite("{\n",2,1,__stream);
      fwrite("  node [shape = plaintext];\n",0x1c,1,__stream);
      fwrite("  edge [style = invis];\n",0x18,1,__stream);
      fwrite("  LevelTitle1 [label=\"\"];\n",0x1a,1,__stream);
      fwrite("  LevelTitle2 [label=\"\"];\n",0x1a,1,__stream);
      uVar16 = uVar15;
      if ((int)uVar10 <= (int)uVar15) {
        do {
          fprintf(__stream,"  Level%d",(ulong)uVar16);
          fwrite(" [label = ",10,1,__stream);
          fputc(0x22,__stream);
          fputc(0x22,__stream);
          fwrite("];\n",3,1,__stream);
          bVar7 = (int)uVar10 < (int)uVar16;
          uVar16 = uVar16 - 1;
        } while (bVar7);
      }
      fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,__stream);
      uVar16 = uVar15;
      if ((int)uVar10 <= (int)uVar15) {
        do {
          fprintf(__stream,"  Level%d",(ulong)uVar16);
          if (uVar10 == uVar16) {
            fputc(0x3b,__stream);
          }
          else {
            fwrite(" ->",3,1,__stream);
          }
          bVar7 = (int)uVar10 < (int)uVar16;
          uVar16 = uVar16 - 1;
        } while (bVar7);
      }
      fputc(10,__stream);
      fputc(0x7d,__stream);
      fputc(10,__stream);
      fputc(10,__stream);
      fwrite("{\n",2,1,__stream);
      fwrite("  rank = same;\n",0xf,1,__stream);
      fwrite("  LevelTitle1;\n",0xf,1,__stream);
      fwrite("  title1 [shape=plaintext,\n",0x1b,1,__stream);
      fwrite("          fontsize=20,\n",0x17,1,__stream);
      fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
      fwrite("          label=\"",0x11,1,__stream);
      fputs("Network structure visualized by ABC",__stream);
      fwrite("\\n",2,1,__stream);
      fprintf(__stream,"Benchmark \\\"%s\\\". ",pNtk->pName);
      pcVar12 = Extra_TimeStamp();
      fprintf(__stream,"Time was %s. ",pcVar12);
      fwrite("\"\n",2,1,__stream);
      fwrite("         ];\n",0xc,1,__stream);
      fputc(0x7d,__stream);
      fputc(10,__stream);
      fputc(10,__stream);
      fwrite("{\n",2,1,__stream);
      fwrite("  rank = same;\n",0xf,1,__stream);
      fwrite("  LevelTitle2;\n",0xf,1,__stream);
      fwrite("  title2 [shape=plaintext,\n",0x1b,1,__stream);
      fwrite("          fontsize=18,\n",0x17,1,__stream);
      fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
      fwrite("          label=\"",0x11,1,__stream);
      if (pNtk->nObjs == vNodes->nSize) {
        uVar16 = pNtk->nObjCounts[7];
        uVar14 = pNtk->nObjCounts[8];
        pcVar12 = "The network contains %d logic nodes and %d latches.";
      }
      else {
        uVar16 = Abc_NtkCountLogicNodes(vNodes);
        uVar14 = (uVar15 - uVar10) + 1;
        pcVar12 = "The set contains %d logic nodes and spans %d levels.";
      }
      fprintf(__stream,pcVar12,(ulong)uVar16,(ulong)uVar14);
      fwrite("\\n",2,1,__stream);
      fwrite("\"\n",2,1,__stream);
      fwrite("         ];\n",0xc,1,__stream);
      fputc(0x7d,__stream);
      fputc(10,__stream);
      fputc(10,__stream);
      if (iVar8 != 0) {
        fwrite("{\n",2,1,__stream);
        fwrite("  rank = same;\n",0xf,1,__stream);
        fprintf(__stream,"  Level%d;\n",(ulong)uVar15);
        if (0 < vNodes->nSize) {
          lVar11 = 0;
          do {
            pAVar3 = (Abc_Obj_t *)vNodes->pArray[lVar11];
            uVar16 = *(uint *)&pAVar3->field_0x14 & 0xf;
            if (0xfffffffd < uVar16 - 5) {
              pAVar17 = pAVar3;
              if (uVar16 == 4) {
                pAVar17 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray];
              }
              uVar16 = pAVar3->Id;
              pcVar13 = Abc_ObjName(pAVar17);
              pcVar12 = "T = %d\t\t";
              if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 4) {
                pcVar12 = "mem_data_in";
              }
              fprintf(__stream,"  Node%d [label = \"%s%s\"",(ulong)uVar16,pcVar13,pcVar12 + 8);
              pcVar12 = "invtriangle";
              if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 4) {
                pcVar12 = "box";
              }
              fprintf(__stream,", shape = %s",pcVar12);
              if ((pAVar3->field_0x14 & 0x20) != 0) {
                fwrite(", style = filled",0x10,1,__stream);
              }
              fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
              fwrite("];\n",3,1,__stream);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < vNodes->nSize);
        }
        fputc(0x7d,__stream);
        fputc(10,__stream);
        fputc(10,__stream);
      }
      uVar16 = uVar15 - iVar8;
      if ((int)uVar10 <= (int)uVar16 && (uVar16 != 0 && iVar8 <= (int)uVar15)) {
        uVar14 = 1;
        if (1 < uVar10) {
          uVar14 = uVar10;
        }
        do {
          fwrite("{\n",2,1,__stream);
          fwrite("  rank = same;\n",0xf,1,__stream);
          fprintf(__stream,"  Level%d;\n",(ulong)uVar16);
          if (0 < vNodes->nSize) {
            lVar11 = 0;
LAB_003422ad:
            pvVar4 = vNodes->pArray[lVar11];
            if ((*(uint *)((long)pvVar4 + 0x14) >> 0xc == uVar16) &&
               (*(int *)((long)pvVar4 + 0x1c) != 0)) {
              pcVar12 = "";
              if (pNtk->ntkType != ABC_NTK_STRASH) {
                pGate = *(Mio_Gate_t **)((long)pvVar4 + 0x38);
                if (pNtk->ntkFunc != ABC_FUNC_MAP || fGateNames == 0) {
                  if (pNtk->ntkFunc != ABC_FUNC_MAP) {
                    pcVar12 = &Abc_NtkPrintSop_Buffer;
                    do {
                      cVar2 = *(char *)&pGate->pName;
                      if (cVar2 == '\n') {
                        pcVar12[0] = '\\';
                        pcVar12[1] = 'n';
                        pcVar12 = pcVar12 + 2;
                      }
                      else {
                        if (cVar2 == '\0') goto LAB_00342363;
                        *pcVar12 = cVar2;
                        pcVar12 = pcVar12 + 1;
                      }
                      pGate = (Mio_Gate_t *)((long)&pGate->pName + 1);
                    } while( true );
                  }
                  pcVar12 = Mio_GateReadSop(pGate);
                  pcVar13 = &Abc_NtkPrintSop_Buffer;
                  do {
                    cVar2 = *pcVar12;
                    if (cVar2 == '\n') {
                      pcVar13[0] = '\\';
                      pcVar13[1] = 'n';
                      pcVar13 = pcVar13 + 2;
                    }
                    else {
                      if (cVar2 == '\0') goto LAB_0034235d;
                      *pcVar13 = cVar2;
                      pcVar13 = pcVar13 + 1;
                    }
                    pcVar12 = pcVar12 + 1;
                  } while( true );
                }
                pcVar12 = Mio_GateReadName(pGate);
              }
              goto LAB_0034236e;
            }
            goto LAB_003423d6;
          }
LAB_003423e6:
          fputc(0x7d,__stream);
          fputc(10,__stream);
          fputc(10,__stream);
          bVar7 = (int)uVar14 < (int)uVar16;
          uVar16 = uVar16 - 1;
        } while (bVar7);
      }
      if (uVar10 == 0) {
        fwrite("{\n",2,1,__stream);
        fwrite("  rank = same;\n",0xf,1,__stream);
        fprintf(__stream,"  Level%d;\n",0);
        if (0 < vNodes->nSize) {
          lVar11 = 0;
          do {
            pAVar3 = (Abc_Obj_t *)vNodes->pArray[lVar11];
            uVar10 = *(uint *)&pAVar3->field_0x14 & 0xf;
            if ((uVar10 == 2) || (uVar10 == 5)) {
              pAVar17 = pAVar3;
              if (uVar10 == 5) {
                pAVar17 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
              }
              uVar10 = pAVar3->Id;
              pcVar12 = Abc_ObjName(pAVar17);
              fprintf(__stream,"  Node%d [label = \"%s\"",(ulong)uVar10,pcVar12);
              pcVar12 = ", shape = triangle";
              if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 5) {
                pcVar12 = ", shape = box";
              }
              fprintf(__stream,", shape = %s",pcVar12 + 10);
LAB_00342511:
              if ((pAVar3->field_0x14 & 0x20) != 0) {
                fwrite(", style = filled",0x10,1,__stream);
              }
              fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
              fwrite("];\n",3,1,__stream);
            }
            else if (((pAVar3->vFanins).nSize == 0) && (0 < (pAVar3->vFanouts).nSize)) {
              uVar10 = pAVar3->Id;
              uVar18 = 1;
              if (pAVar3->pNtk->ntkType != ABC_NTK_STRASH) {
                iVar8 = Abc_NodeIsConst1(pAVar3);
                uVar18 = (ulong)(iVar8 != 0);
              }
              fprintf(__stream,"  Node%d [label = \"Const%d\"",(ulong)uVar10,uVar18);
              fwrite(", shape = ellipse",0x11,1,__stream);
              goto LAB_00342511;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < vNodes->nSize);
        }
        fputc(0x7d,__stream);
        fputc(10,__stream);
        fputc(10,__stream);
      }
      fwrite("title1 -> title2 [style = invis];\n",0x22,1,__stream);
      if (0 < vNodes->nSize) {
        lVar11 = 0;
        do {
          if (*(uint *)((long)vNodes->pArray[lVar11] + 0x14) >> 0xc == uVar15) {
            fprintf(__stream,"title2 -> Node%d [style = invis];\n",
                    (ulong)*(uint *)((long)vNodes->pArray[lVar11] + 0x10));
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < vNodes->nSize);
      }
      if (0 < vNodes->nSize) {
        iVar8 = -1;
        lVar11 = 0;
        do {
          pvVar4 = vNodes->pArray[lVar11];
          uVar10 = *(uint *)((long)pvVar4 + 0x14);
          if ((uVar10 & 0xf) == 3 && uVar10 >> 0xc == uVar15) {
            if (-1 < iVar8) {
              fprintf(__stream,"Node%d -> Node%d [style = invis];\n");
            }
            iVar8 = *(int *)((long)pvVar4 + 0x10);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < vNodes->nSize);
      }
      if (0 < vNodes->nSize) {
        lVar11 = 0;
        do {
          plVar5 = (long *)vNodes->pArray[lVar11];
          if (((*(uint *)((long)plVar5 + 0x14) & 0xf) != 8) && (0 < *(int *)((long)plVar5 + 0x1c)))
          {
            uVar18 = 0;
            do {
              lVar6 = *(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                               (long)*(int *)(plVar5[4] + uVar18 * 4) * 8);
              if ((*(uint *)(lVar6 + 0x14) & 0xf) != 8) {
                pcVar12 = "solid";
                if (pNtk->ntkType == ABC_NTK_STRASH) {
                  if (1 < uVar18) {
                    __assert_fail("i >=0 && i < 2",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                                  ,0x17d,"int Abc_ObjFaninC(Abc_Obj_t *, int)");
                  }
                  pcVar12 = "dotted";
                  if ((*(uint *)((long)plVar5 + 0x14) & (uint)(uVar18 != 0) * 0x400 + 0x400) == 0) {
                    pcVar12 = "solid";
                  }
                }
                fprintf(__stream,"Node%d",(ulong)*(uint *)(plVar5 + 2));
                fwrite(" -> ",4,1,__stream);
                fprintf(__stream,"Node%d",(ulong)*(uint *)(lVar6 + 0x10));
                fprintf(__stream," [style = %s",pcVar12);
                fputc(0x5d,__stream);
                fwrite(";\n",2,1,__stream);
              }
              uVar18 = uVar18 + 1;
            } while ((long)uVar18 < (long)*(int *)((long)plVar5 + 0x1c));
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < vNodes->nSize);
      }
      fputc(0x7d,__stream);
      fputc(10,__stream);
      fputc(10,__stream);
      fclose(__stream);
      if (0 < vNodes->nSize) {
        lVar11 = 0;
        do {
          puVar1 = (uint *)((long)vNodes->pArray[lVar11] + 0x14);
          *puVar1 = *puVar1 & 0xffffffbf;
          lVar11 = lVar11 + 1;
        } while (lVar11 < vNodes->nSize);
      }
      if ((vNodesShow != (Vec_Ptr_t *)0x0) && (0 < vNodesShow->nSize)) {
        lVar11 = 0;
        do {
          puVar1 = (uint *)((long)vNodesShow->pArray[lVar11] + 0x14);
          *puVar1 = *puVar1 & 0xffffffdf;
          lVar11 = lVar11 + 1;
        } while (lVar11 < vNodesShow->nSize);
      }
      if (!bVar19) {
        Abc_NtkSopToBdd(pNtk);
        return;
      }
      return;
    }
    pcVar12 = "Io_WriteDotNtk(): Converting to SOPs has failed.";
  }
  puts(pcVar12);
  return;
LAB_00342363:
  pcVar12[-2] = '\0';
  goto LAB_00342367;
LAB_0034235d:
  pcVar13[-2] = '\0';
LAB_00342367:
  pcVar12 = &Abc_NtkPrintSop_Buffer;
LAB_0034236e:
  fprintf(__stream,"  Node%d [label = \"%d\\n%s\"",(ulong)*(uint *)((long)pvVar4 + 0x10),
          (ulong)*(uint *)((long)pvVar4 + 0x10),pcVar12);
  fwrite(", shape = ellipse",0x11,1,__stream);
  if ((*(byte *)((long)pvVar4 + 0x14) & 0x20) != 0) {
    fwrite(", style = filled",0x10,1,__stream);
  }
  fwrite("];\n",3,1,__stream);
LAB_003423d6:
  lVar11 = lVar11 + 1;
  if (vNodes->nSize <= lVar11) goto LAB_003423e6;
  goto LAB_003422ad;
}

Assistant:

void Io_WriteDotNtk( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodes, Vec_Ptr_t * vNodesShow, char * pFileName, int fGateNames, int fUseReverse )
{
    FILE * pFile;
    Abc_Obj_t * pNode, * pFanin;
    char * pSopString;
    int LevelMin, LevelMax, fHasCos, Level, i, k, fHasBdds, fCompl, Prev;
    int Limit = 500;

    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk) );

    if ( vNodes->nSize < 1 )
    {
        printf( "The set has no nodes. DOT file is not written.\n" );
        return;
    }

    if ( vNodes->nSize > Limit )
    {
        printf( "The set has more than %d nodes. DOT file is not written.\n", Limit );
        return;
    }

    // start the stream
    if ( (pFile = fopen( pFileName, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", pFileName );
        return;
    }

    // transform logic functions from BDD to SOP
    if ( (fHasBdds = Abc_NtkIsBddLogic(pNtk)) )
    {
        if ( !Abc_NtkBddToSop(pNtk, -1, ABC_INFINITY) )
        {
            printf( "Io_WriteDotNtk(): Converting to SOPs has failed.\n" );
            return;
        }
    }

    // mark the nodes from the set
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        pNode->fMarkC = 1;
    if ( vNodesShow )
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodesShow, pNode, i )
            pNode->fMarkB = 1;

    // get the levels of nodes
    LevelMax = Abc_NtkLevel( pNtk );
    if ( fUseReverse )
    {
        LevelMin = Abc_NtkLevelReverse( pNtk );
        assert( LevelMax == LevelMin );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
            if ( Abc_ObjIsNode(pNode) )
                pNode->Level = LevelMax - pNode->Level + 1;
    }

    // find the largest and the smallest levels
    LevelMin = 10000;
    LevelMax = -1;
    fHasCos  = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjIsCo(pNode) )
        {
            fHasCos = 1;
            continue;
        }
        if ( LevelMin > (int)pNode->Level )
            LevelMin = pNode->Level;
        if ( LevelMax < (int)pNode->Level )
            LevelMax = pNode->Level;
    }

    // set the level of the CO nodes
    if ( fHasCos )
    {
        LevelMax++;
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            if ( Abc_ObjIsCo(pNode) )
                pNode->Level = LevelMax;
        }
    }

    // write the DOT header
    fprintf( pFile, "# %s\n",  "Network structure generated by ABC" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "digraph network {\n" );
    fprintf( pFile, "size = \"7.5,10\";\n" );
//    fprintf( pFile, "size = \"10,8.5\";\n" );
//    fprintf( pFile, "size = \"14,11\";\n" );
//    fprintf( pFile, "page = \"8,11\";\n" );
//  fprintf( pFile, "ranksep = 0.5;\n" );
//  fprintf( pFile, "nodesep = 0.5;\n" );
    fprintf( pFile, "center = true;\n" );
//    fprintf( pFile, "orientation = landscape;\n" );
//  fprintf( pFile, "edge [fontsize = 10];\n" );
//  fprintf( pFile, "edge [dir = none];\n" );
    fprintf( pFile, "edge [dir = back];\n" );
    fprintf( pFile, "\n" );

    // labels on the left of the picture
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  node [shape = plaintext];\n" );
    fprintf( pFile, "  edge [style = invis];\n" );
    fprintf( pFile, "  LevelTitle1 [label=\"\"];\n" );
    fprintf( pFile, "  LevelTitle2 [label=\"\"];\n" );
    // generate node names with labels
    for ( Level = LevelMax; Level >= LevelMin; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d", Level );
        fprintf( pFile, " [label = " );
        // label name
        fprintf( pFile, "\"" );
        fprintf( pFile, "\"" );
        fprintf( pFile, "];\n" );
    }

    // genetate the sequence of visible/invisible nodes to mark levels
    fprintf( pFile, "  LevelTitle1 ->  LevelTitle2 ->" );
    for ( Level = LevelMax; Level >= LevelMin; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d",  Level );
        // the connector
        if ( Level != LevelMin )
            fprintf( pFile, " ->" );
        else
            fprintf( pFile, ";" );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate title box on top
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle1;\n" );
    fprintf( pFile, "  title1 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=20,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "%s", "Network structure visualized by ABC" );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "Benchmark \\\"%s\\\". ", pNtk->pName );
    fprintf( pFile, "Time was %s. ",  Extra_TimeStamp() );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate statistics box
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle2;\n" );
    fprintf( pFile, "  title2 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=18,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    if ( Abc_NtkObjNum(pNtk) == Vec_PtrSize(vNodes) )
        fprintf( pFile, "The network contains %d logic nodes and %d latches.", Abc_NtkNodeNum(pNtk), Abc_NtkLatchNum(pNtk) );
    else
        fprintf( pFile, "The set contains %d logic nodes and spans %d levels.", Abc_NtkCountLogicNodes(vNodes), LevelMax - LevelMin + 1 );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate the POs
    if ( fHasCos )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  LevelMax );
        // generate the PO nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            if ( !Abc_ObjIsCo(pNode) )
                continue;
            fprintf( pFile, "  Node%d [label = \"%s%s\"", 
                pNode->Id, 
                (Abc_ObjIsBi(pNode)? Abc_ObjName(Abc_ObjFanout0(pNode)):Abc_ObjName(pNode)), 
                (Abc_ObjIsBi(pNode)? "_in":"") );
            fprintf( pFile, ", shape = %s", (Abc_ObjIsBi(pNode)? "box":"invtriangle") );
            if ( pNode->fMarkB )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, ", color = coral, fillcolor = coral" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate nodes of each rank
    for ( Level = LevelMax - fHasCos; Level >= LevelMin && Level > 0; Level-- )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  Level );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            if ( (int)pNode->Level != Level )
                continue;
            if ( Abc_ObjFaninNum(pNode) == 0 )
                continue;

/*
            int SuppSize;
            Vec_Ptr_t * vSupp;
            if ( (int)pNode->Level != Level )
                continue;
            if ( Abc_ObjFaninNum(pNode) == 0 )
                continue;
            vSupp = Abc_NtkNodeSupport( pNtk, &pNode, 1 );
            SuppSize = Vec_PtrSize( vSupp );
            Vec_PtrFree( vSupp ); 
*/

//            fprintf( pFile, "  Node%d [label = \"%d\"", pNode->Id, pNode->Id );
            if ( Abc_NtkIsStrash(pNtk) )
                pSopString = "";
            else if ( Abc_NtkHasMapping(pNtk) && fGateNames )
                pSopString = Mio_GateReadName((Mio_Gate_t *)pNode->pData);
            else if ( Abc_NtkHasMapping(pNtk) )
                pSopString = Abc_NtkPrintSop(Mio_GateReadSop((Mio_Gate_t *)pNode->pData));
            else
                pSopString = Abc_NtkPrintSop((char *)pNode->pData);
            fprintf( pFile, "  Node%d [label = \"%d\\n%s\"", pNode->Id, pNode->Id, pSopString );
//            fprintf( pFile, "  Node%d [label = \"%d\\n%s\"", pNode->Id, 
//                SuppSize, 
//                pSopString );

            fprintf( pFile, ", shape = ellipse" );
            if ( pNode->fMarkB )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate the PI nodes if any
    if ( LevelMin == 0 )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  LevelMin );
        // generate the PO nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            if ( !Abc_ObjIsCi(pNode) )
            {
                // check if the costant node is present
                if ( Abc_ObjFaninNum(pNode) == 0 && Abc_ObjFanoutNum(pNode) > 0 )
                {
                    fprintf( pFile, "  Node%d [label = \"Const%d\"", pNode->Id, Abc_NtkIsStrash(pNode->pNtk) || Abc_NodeIsConst1(pNode) );
                    fprintf( pFile, ", shape = ellipse" );
                    if ( pNode->fMarkB )
                        fprintf( pFile, ", style = filled" );
                    fprintf( pFile, ", color = coral, fillcolor = coral" );
                    fprintf( pFile, "];\n" );
                }
                continue;
            }
            fprintf( pFile, "  Node%d [label = \"%s\"", 
                pNode->Id, 
                (Abc_ObjIsBo(pNode)? Abc_ObjName(Abc_ObjFanin0(pNode)):Abc_ObjName(pNode)) );
            fprintf( pFile, ", shape = %s", (Abc_ObjIsBo(pNode)? "box":"triangle") );
            if ( pNode->fMarkB )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, ", color = coral, fillcolor = coral" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate invisible edges from the square down
    fprintf( pFile, "title1 -> title2 [style = invis];\n" );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( (int)pNode->Level != LevelMax )
            continue;
        fprintf( pFile, "title2 -> Node%d [style = invis];\n", pNode->Id );
    }
    // generate invisible edges among the COs
    Prev = -1;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( (int)pNode->Level != LevelMax )
            continue;
        if ( !Abc_ObjIsPo(pNode) )
            continue;
        if ( Prev >= 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, pNode->Id );
        Prev = pNode->Id;
    }

    // generate edges
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjIsLatch(pNode) )
            continue;
        Abc_ObjForEachFanin( pNode, pFanin, k )
        {
            if ( Abc_ObjIsLatch(pFanin) )
                continue;
            fCompl = 0;
            if ( Abc_NtkIsStrash(pNtk) )
                fCompl = Abc_ObjFaninC(pNode, k);
            // generate the edge from this node to the next
            fprintf( pFile, "Node%d",  pNode->Id );
            fprintf( pFile, " -> " );
            fprintf( pFile, "Node%d",  pFanin->Id );
            fprintf( pFile, " [style = %s", fCompl? "dotted" : "solid" );
//            fprintf( pFile, ", label = \"%c\"", 'a' + k );
            fprintf( pFile, "]" );
            fprintf( pFile, ";\n" );
        }
    }

    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );

    // unmark the nodes from the set
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        pNode->fMarkC = 0;
    if ( vNodesShow )
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodesShow, pNode, i )
            pNode->fMarkB = 0;

    // convert the network back into BDDs if this is how it was
    if ( fHasBdds )
        Abc_NtkSopToBdd(pNtk);
}